

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

double s2pred::GetSin2Distance(S2Point *x,S2Point *y,double *error)

{
  double dVar1;
  __type_conflict _Var2;
  __type_conflict _Var3;
  double dVar4;
  double d2;
  D local_50;
  undefined1 local_38 [8];
  S2Point n;
  double *error_local;
  S2Point *y_local;
  S2Point *x_local;
  
  n.c_[2] = (VType)error;
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            (&local_50,(BasicVector<Vector3,_double,_3UL> *)x,y);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+
            ((D *)&d2,(BasicVector<Vector3,_double,_3UL> *)x,y);
  Vector3<double>::CrossProd((Vector3<double> *)local_38,&local_50,(Vector3<double> *)&d2);
  dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)local_38);
  dVar1 = dVar1 * 0.25;
  _Var2 = std::sqrt<int>(3);
  _Var3 = std::sqrt<int>(3);
  dVar4 = sqrt(dVar1);
  *(double *)n.c_[2] =
       (_Var2 * 4.0 + 21.0) * 1.1102230246251565e-16 * dVar1 +
       _Var3 * 32.0 * 1.1102230246251565e-16 * 1.1102230246251565e-16 * dVar4 +
       1.166815364598964e-61;
  return dVar1;
}

Assistant:

inline double GetSin2Distance(const S2Point& x, const S2Point& y,
                              double* error) {
  // The (x-y).CrossProd(x+y) trick eliminates almost all of error due to "x"
  // and "y" being not quite unit length.  This method is extremely accurate
  // for small distances; the *relative* error in the result is O(DBL_ERR) for
  // distances as small as DBL_ERR.
  S2Point n = (x - y).CrossProd(x + y);
  double d2 = 0.25 * n.Norm2();
  *error = ((21 + 4 * sqrt(3)) * DBL_ERR * d2 +
            32 * sqrt(3) * DBL_ERR * DBL_ERR * sqrt(d2) +
            768 * DBL_ERR * DBL_ERR * DBL_ERR * DBL_ERR);
  return d2;
}